

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclBackend.cpp
# Opt level: O0

void __thiscall
xmrig::OclBackendPrivate::OclBackendPrivate(OclBackendPrivate *this,Controller *controller)

{
  Config *this_00;
  OclConfig *ctx;
  Base *in_RSI;
  OclBackendPrivate *in_RDI;
  
  (((vector<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
     *)&in_RDI->controller)->
  super__Vector_base<xmrig::Thread<xmrig::OclLaunchData>_*,_std::allocator<xmrig::Thread<xmrig::OclLaunchData>_*>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)in_RSI;
  OclContext::OclContext(&in_RDI->context);
  OclLaunchStatus::OclLaunchStatus(&in_RDI->status);
  OclPlatform::OclPlatform(&in_RDI->platform);
  std::vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_>::vector
            ((vector<xmrig::OclDevice,_std::allocator<xmrig::OclDevice>_> *)0x20b58d);
  std::vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_>::vector
            ((vector<xmrig::OclLaunchData,_std::allocator<xmrig::OclLaunchData>_> *)0x20b5a0);
  Workers<xmrig::OclLaunchData>::Workers((Workers<xmrig::OclLaunchData> *)in_RDI);
  this_00 = Base::config(in_RSI);
  ctx = Config::cl(this_00);
  init(in_RDI,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

inline OclBackendPrivate(Controller *controller) :
        controller(controller)
    {
        init(controller->config()->cl());
    }